

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O0

unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
 __thiscall duckdb::EnumColumnWriter::InitializeStatsState(EnumColumnWriter *this)

{
  _Head_base<0UL,_duckdb::ColumnWriterStatistics_*,_false> in_RDI;
  _Head_base<0UL,_duckdb::ColumnWriterStatistics_*,_false> this_00;
  
  this_00._M_head_impl = in_RDI._M_head_impl;
  make_uniq<duckdb::StringStatisticsState>();
  unique_ptr<duckdb::ColumnWriterStatistics,std::default_delete<duckdb::ColumnWriterStatistics>,true>
  ::
  unique_ptr<duckdb::StringStatisticsState,std::default_delete<std::unique_ptr<duckdb::ColumnWriterStatistics,std::default_delete<duckdb::ColumnWriterStatistics>>>,void>
            ((unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
              *)this_00._M_head_impl,
             (unique_ptr<duckdb::StringStatisticsState,_std::default_delete<duckdb::StringStatisticsState>_>
              *)in_RDI._M_head_impl);
  unique_ptr<duckdb::StringStatisticsState,_std::default_delete<duckdb::StringStatisticsState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::StringStatisticsState,_std::default_delete<duckdb::StringStatisticsState>,_true>
                 *)0x86a54c);
  return (unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
          )(_Tuple_impl<0UL,_duckdb::ColumnWriterStatistics_*,_std::default_delete<duckdb::ColumnWriterStatistics>_>
            )this_00._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriterStatistics> EnumColumnWriter::InitializeStatsState() {
	return make_uniq<StringStatisticsState>();
}